

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring.h
# Opt level: O1

int CBS_is_valid_asn1_oid(CBS *cbs)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  
  sVar3 = cbs->len;
  if (sVar3 == 0) {
    return 0;
  }
  puVar1 = cbs->data;
  uVar2 = '\0';
  while( true ) {
    bVar5 = sVar3 != 0;
    bVar4 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar4) break;
    uVar2 = *puVar1;
    puVar1 = puVar1 + bVar5;
  }
  return (int)(-1 < (char)uVar2);
}

Assistant:

OPENSSL_INLINE size_t CBS_len(const CBS *cbs) { return cbs->len; }